

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rank_parser.cc
# Opt level: O0

void __thiscall rank::parser::Parser::R(Parser *this,int d)

{
  bool bVar1;
  TokenType TVar2;
  pointer this_00;
  Rank *pRVar3;
  int d_local;
  Parser *this_local;
  
  bVar1 = token_available(this);
  if (bVar1) {
    TVar2 = scanner::Token::type(&this->_token);
    if (TVar2 == TK_LBracket) {
      advance(this);
      this_00 = std::unique_ptr<rank::RankList,_std::default_delete<rank::RankList>_>::operator->
                          (&this->_problem);
      pRVar3 = RankList::rank(this_00);
      this->_rank = pRVar3;
      L(this,d + 1);
      this->_rank = (Rank *)0x0;
      bVar1 = advance_if(this,TK_RBracket);
      if (bVar1) {
        RC(this,d + 1);
      }
      else {
        this->_ok = false;
      }
    }
    else {
      this->_ok = false;
    }
  }
  else {
    this->_ok = false;
  }
  return;
}

Assistant:

void Parser::R(int d) {

        if (!token_available()) { _ok=false; return; }

        if (_token.type() == TK_LBracket) { // E -> ident X

#ifdef LOG_PRODUCTIONS
            std::cerr << std::string(4*d,'.') << "R -> '[' L ']' RC" << std::endl;
#endif

            advance();

            {
                _rank = _problem->rank(); // new rank
            }

            L(d+1);

            {
                _rank = nullptr; // new rank
            }

            if (!advance_if(TK_RBracket)) { _ok=false;  return; }

            RC(d+1);

        }
        else {
            _ok = false;
        }

    }